

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          string_view fileSetType,string_view description,bool clear)

{
  cmMakefile *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  cmFileSet *this_00;
  bool bVar2;
  string *this_01;
  undefined1 local_1e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1b8;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  string local_128;
  cmTargetInternals *local_108;
  pointer local_100;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f8;
  cmAlphaNum local_d8;
  size_t local_a8;
  __node_base_ptr p_Stack_a0;
  cmAlphaNum local_98;
  string local_68;
  cmFileSet *local_48;
  cmFileSet *fileSet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_38;
  bool clear_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *fileSetName_local;
  cmTarget *self_local;
  cmTargetInternals *this_local;
  string_view fileSetType_local;
  
  fileSetType_local._M_len = (size_t)fileSetType._M_str;
  this_local = (cmTargetInternals *)fileSetType._M_len;
  fileSet._7_1_ = clear;
  pbStack_38 = value;
  value_local = fileSetName;
  fileSetName_local = (string *)self;
  self_local = (cmTarget *)this;
  local_48 = cmTarget::GetFileSet(self,fileSetName);
  if (local_48 == (cmFileSet *)0x0) {
    pcVar1 = this->Makefile;
    local_a8 = description._M_len;
    p_Stack_a0 = (__node_base_ptr)description._M_str;
    cmAlphaNum::cmAlphaNum(&local_98,description);
    cmAlphaNum::cmAlphaNum(&local_d8,"has not yet been created.");
    cmStrCat<>(&local_68,&local_98,&local_d8);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    this_01 = cmFileSet::GetType_abi_cxx11_(local_48);
    local_f8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    local_108 = this_local;
    local_100 = (pointer)fileSetType_local._M_len;
    __y._M_str = (char *)fileSetType_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar2 = std::operator!=(local_f8,__y);
    if (bVar2) {
      pcVar1 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_158,"File set \"");
      cmAlphaNum::cmAlphaNum(&local_188,value_local);
      cmStrCat<char[19],std::basic_string_view<char,std::char_traits<char>>,char[3]>
                (&local_128,&local_158,&local_188,(char (*) [19])"\" is not of type \"",
                 (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 (char (*) [3])0xd2b755);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      if ((fileSet._7_1_ & 1) != 0) {
        cmFileSet::ClearDirectoryEntries(local_48);
      }
      bVar2 = (anonymous_namespace)::StringIsEmpty<std::__cxx11::string>(value);
      this_00 = local_48;
      if (!bVar2) {
        std::__cxx11::string::string((string *)(local_1e8 + 0x10),(string *)value);
        cmMakefile::GetBacktrace((cmMakefile *)local_1e8);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1e8 + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1e8 + 0x10),(cmListFileBacktrace *)local_1e8);
        cmFileSet::AddDirectoryEntry
                  (this_00,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_1e8 + 0x30));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1e8 + 0x30));
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1e8);
        std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
      }
    }
  }
  return;
}

Assistant:

void cmTargetInternals::AddDirectoryToFileSet(
  cmTarget* self, std::string const& fileSetName, ValueType value,
  cm::string_view fileSetType, cm::string_view description, bool clear)
{
  auto* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(description, "has not yet been created."));
    return;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return;
  }
  if (clear) {
    fileSet->ClearDirectoryEntries();
  }
  if (!StringIsEmpty(value)) {
    fileSet->AddDirectoryEntry(
      BT<std::string>(value, this->Makefile->GetBacktrace()));
  }
}